

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

UnaryFunctionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_unary(NeuralNetworkLayer *this)

{
  bool bVar1;
  UnaryFunctionLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_unary(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_unary(this);
    this_00 = (UnaryFunctionLayerParams *)operator_new(0x28);
    UnaryFunctionLayerParams::UnaryFunctionLayerParams(this_00);
    (this->layer_).unary_ = this_00;
  }
  return (UnaryFunctionLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams* NeuralNetworkLayer::mutable_unary() {
  if (!has_unary()) {
    clear_layer();
    set_has_unary();
    layer_.unary_ = new ::CoreML::Specification::UnaryFunctionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.unary)
  return layer_.unary_;
}